

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

void __thiscall
Minisat::Clause::Clause<Minisat::vec<Minisat::Lit>>
          (Clause *this,vec<Minisat::Lit> *ps,bool use_extra,bool learnt)

{
  uint uVar1;
  int iVar2;
  Lit *pLVar3;
  byte in_CL;
  byte in_DL;
  vec<Minisat::Lit> *in_RSI;
  ulong *in_RDI;
  int i;
  int local_18;
  
  *in_RDI = *in_RDI & 0xfffffffffffffffc;
  *in_RDI = *in_RDI & 0xfffffffffffffffb | (ulong)(in_CL & 1) << 2;
  *in_RDI = *in_RDI & 0xfffffffffffffff7 | (ulong)(in_CL & 1 | in_DL & 1) << 3;
  *in_RDI = *in_RDI & 0xffffffffffffffef;
  uVar1 = vec<Minisat::Lit>::size(in_RSI);
  *in_RDI = *in_RDI & 0x3ffffffff | (ulong)uVar1 << 0x22;
  *in_RDI = *in_RDI & 0xffffffffc000001f;
  *in_RDI = *in_RDI & 0xffffffffbfffffff;
  *in_RDI = *in_RDI & 0xffffffff7fffffff | 0x80000000;
  *in_RDI = *in_RDI & 0xfffffffeffffffff;
  *in_RDI = *in_RDI & 0xfffffffdffffffff;
  for (local_18 = 0; iVar2 = vec<Minisat::Lit>::size(in_RSI), local_18 < iVar2;
      local_18 = local_18 + 1) {
    pLVar3 = vec<Minisat::Lit>::operator[](in_RSI,local_18);
    *(int *)((long)in_RDI + (long)local_18 * 4 + 8) = pLVar3->x;
  }
  if ((*in_RDI >> 3 & 1) != 0) {
    if ((*in_RDI >> 2 & 1) == 0) {
      calcAbstraction((Clause *)in_RSI);
    }
    else {
      *(undefined4 *)((long)in_RDI + (*in_RDI >> 0x22) * 4 + 8) = 0;
      *(undefined4 *)((long)in_RDI + (long)(int)((uint)(*in_RDI >> 0x22) + 1) * 4 + 8) = 0;
    }
  }
  return;
}

Assistant:

Clause(const V &ps, bool use_extra, bool learnt)
    {
        header.mark = 0;
        header.learnt = learnt;
        header.has_extra = learnt | use_extra;
        header.reloced = 0;
        header.size = ps.size();
        header.lbd = 0;
        header.S = 0;
        header.removable = 1;
        // simplify
        //
        header.simplified = 0;
        header.onQueue = 0;

        for (int i = 0; i < ps.size(); i++) data[i].lit = ps[i];

        if (header.has_extra) {
            if (header.learnt) {
                data[header.size].act = 0;
                data[header.size + 1].touched = 0;
            } else
                calcAbstraction();
        }
    }